

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::GetTargetVersion
          (cmGeneratorTarget *this,bool soversion,int *major,int *minor,int *patch)

{
  TargetType TVar1;
  int iVar2;
  char *pcVar3;
  int parsed_patch;
  int parsed_minor;
  int parsed_major;
  int local_60;
  int local_5c;
  int *local_58;
  string local_50;
  
  *major = 0;
  *minor = 0;
  *patch = 0;
  local_58 = patch;
  TVar1 = cmTarget::GetType(this->Target);
  if (TVar1 == INTERFACE_LIBRARY) {
    __assert_fail("this->GetType() != cmStateEnums::INTERFACE_LIBRARY",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorTarget.cxx"
                  ,0x1344,
                  "void cmGeneratorTarget::GetTargetVersion(bool, int &, int &, int &) const");
  }
  pcVar3 = "VERSION";
  if (soversion) {
    pcVar3 = "SOVERSION";
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,pcVar3,pcVar3 + (ulong)soversion * 2 + 7);
  pcVar3 = GetProperty(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (pcVar3 != (char *)0x0) {
    iVar2 = __isoc99_sscanf(pcVar3,"%d.%d.%d",&local_50,&local_5c,&local_60);
    if (iVar2 != 1) {
      if (iVar2 != 2) {
        if (iVar2 != 3) {
          return;
        }
        *local_58 = local_60;
      }
      *minor = local_5c;
    }
    *major = (int)local_50._M_dataplus._M_p;
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetTargetVersion(bool soversion, int& major,
                                         int& minor, int& patch) const
{
  // Set the default values.
  major = 0;
  minor = 0;
  patch = 0;

  assert(this->GetType() != cmStateEnums::INTERFACE_LIBRARY);

  // Look for a VERSION or SOVERSION property.
  const char* prop = soversion ? "SOVERSION" : "VERSION";
  if (const char* version = this->GetProperty(prop)) {
    // Try to parse the version number and store the results that were
    // successfully parsed.
    int parsed_major;
    int parsed_minor;
    int parsed_patch;
    switch (sscanf(version, "%d.%d.%d", &parsed_major, &parsed_minor,
                   &parsed_patch)) {
      case 3:
        patch = parsed_patch;
        CM_FALLTHROUGH;
      case 2:
        minor = parsed_minor;
        CM_FALLTHROUGH;
      case 1:
        major = parsed_major;
        CM_FALLTHROUGH;
      default:
        break;
    }
  }
}